

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderDerivateTests.cpp
# Opt level: O2

Vec4 __thiscall
deqp::gles3::Functional::getDerivateThreshold
          (Functional *this,Precision precision,Vec4 *valueMin,Vec4 *valueMax,Vec4 *expectedDerivate
          )

{
  int s;
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 extraout_XMM0_Db;
  Vec4 VVar4;
  IVec4 numAccurateBits;
  UVec4 numBitsLost;
  UVec4 derivExp;
  Vector<int,_4> local_80;
  Vector<unsigned_int,_4> local_70;
  tcu local_60 [16];
  tcu local_50 [16];
  UVec4 maxValueExp;
  
  s = 0;
  if (precision < PRECISION_LAST) {
    s = *(int *)(&DAT_01862718 + (ulong)precision * 4);
  }
  getCompExpBits(expectedDerivate);
  getCompExpBits(valueMin);
  getCompExpBits(valueMax);
  tcu::max<unsigned_int,4>
            ((tcu *)&maxValueExp,&numBitsLost,(Vector<unsigned_int,_4> *)&numAccurateBits);
  tcu::min<unsigned_int,4>
            ((tcu *)&numAccurateBits,(Vector<unsigned_int,_4> *)&maxValueExp,&derivExp);
  tcu::operator-((tcu *)&numBitsLost,(Vector<unsigned_int,_4> *)&maxValueExp,
                 (Vector<unsigned_int,_4> *)&numAccurateBits);
  tcu::Vector<unsigned_int,_4>::cast<int>(&local_70);
  tcu::operator-(local_60,s,(Vector<int,_4> *)&local_70);
  tcu::operator-(local_50,(Vector<int,_4> *)local_60,3);
  tcu::Vector<int,_4>::Vector(&local_80,0);
  tcu::max<int,4>((tcu *)&numAccurateBits,(Vector<int,_4> *)local_50,&local_80);
  fVar1 = computeFloatingPointError(expectedDerivate->m_data[0],numAccurateBits.m_data[0]);
  fVar2 = computeFloatingPointError(expectedDerivate->m_data[1],numAccurateBits.m_data[1]);
  fVar3 = computeFloatingPointError(expectedDerivate->m_data[2],numAccurateBits.m_data[2]);
  VVar4.m_data[0] = computeFloatingPointError(expectedDerivate->m_data[3],numAccurateBits.m_data[3])
  ;
  VVar4.m_data[1] = (float)extraout_XMM0_Db;
  *(float *)this = fVar1;
  *(float *)(this + 4) = fVar2;
  *(float *)(this + 8) = fVar3;
  *(float *)(this + 0xc) = VVar4.m_data[0];
  VVar4.m_data[2] = fVar3;
  VVar4.m_data[3] = 0.0;
  return (Vec4)VVar4.m_data;
}

Assistant:

static inline tcu::Vec4 getDerivateThreshold (const glu::Precision precision, const tcu::Vec4& valueMin, const tcu::Vec4& valueMax, const tcu::Vec4& expectedDerivate)
{
	const int			baseBits		= getNumMantissaBits(precision);
	const tcu::UVec4	derivExp		= getCompExpBits(expectedDerivate);
	const tcu::UVec4	maxValueExp		= max(getCompExpBits(valueMin), getCompExpBits(valueMax));
	const tcu::UVec4	numBitsLost		= maxValueExp - min(maxValueExp, derivExp);
	const tcu::IVec4	numAccurateBits	= max(baseBits - numBitsLost.asInt() - (int)INTERPOLATION_LOST_BITS, tcu::IVec4(0));

	return tcu::Vec4(computeFloatingPointError(expectedDerivate[0], numAccurateBits[0]),
					 computeFloatingPointError(expectedDerivate[1], numAccurateBits[1]),
					 computeFloatingPointError(expectedDerivate[2], numAccurateBits[2]),
					 computeFloatingPointError(expectedDerivate[3], numAccurateBits[3]));
}